

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xlat_parser.c
# Opt level: O3

void XlatParse(void *yyp,int yymajor,FParseToken yyminor,FParseContext *context)

{
  uint *puVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  FParseContext *pFVar6;
  long *plVar7;
  undefined8 *puVar8;
  FBoomArg *pFVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  FLineTrans *pFVar17;
  FSectorTrans *pFVar18;
  FSectorMask *pFVar19;
  undefined7 uVar20;
  undefined1 uVar21;
  int iVar22;
  long lVar23;
  ushort *puVar24;
  undefined8 *puVar25;
  int *piVar26;
  ushort *puVar27;
  int iVar28;
  int extraout_EDX;
  uint uVar29;
  undefined8 uVar30;
  ushort *puVar31;
  FParseToken *pFVar32;
  double *pdVar33;
  uchar uVar34;
  int i;
  ulong uVar35;
  long *plVar36;
  ulong uVar37;
  byte bVar38;
  int iVar39;
  int iVar40;
  undefined4 uVar41;
  int iVar42;
  int iVar43;
  FXlatExprState state;
  undefined8 local_d8;
  undefined4 auStack_d0 [6];
  undefined8 local_b8;
  undefined6 uStack_b0;
  undefined2 uStack_aa;
  undefined6 uStack_a8;
  ushort *local_80;
  int local_78;
  uint local_74;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  FXlatExprState local_3c;
  
  bVar38 = 0;
  puVar27 = *yyp;
  if (puVar27 == (ushort *)0x0) {
    __assert_fail("yypParser->yytos!=0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O3/src/xlat_parser.c"
                  ,0x740,"void XlatParse(void *, int, FParseToken, FParseContext *)");
  }
  *(FParseContext **)((long)yyp + 0x10) = context;
  if (yyTraceFILE != (FILE *)0x0) {
    fprintf((FILE *)yyTraceFILE,"%sInput \'%s\'\n",yyTracePrompt,yyTokenName[yymajor]);
    fflush((FILE *)yyTraceFILE);
    puVar27 = *yyp;
  }
  local_70 = (long)yyp + 0x2220;
  local_80 = (ushort *)((long)yyp + 0x18);
  local_68 = (ulong)(yymajor & 0xff);
  do {
    puVar31 = local_80;
    uVar3 = *puVar27;
    if (uVar3 < 0xe9) {
      if (99 < uVar3) {
        __assert_fail("stateno <= YY_SHIFT_COUNT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O3/src/xlat_parser.c"
                      ,0x2ec,"unsigned int yy_find_shift_action(yyParser *, unsigned char)");
      }
      uVar34 = (uchar)yymajor;
      if (uVar34 == 'G') {
        __assert_fail("iLookAhead!=YYNOCODE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O3/src/xlat_parser.c"
                      ,0x2ef,"unsigned int yy_find_shift_action(yyParser *, unsigned char)");
      }
      lVar23 = yy_shift_ofst[uVar3] + local_68;
      if (((uint)lVar23 < 0x166) &&
         ("+,-./012345)*8:;\x02\x03\x04\x05\x06\a\b\t\x0f\x02\x03\x04\x05\x06\a\b\t\x02\x03\x04\x05\x06\a\b\t\x05\x06\a\b\t ABC$%&"
          [lVar23] == uVar34)) {
        puVar24 = yy_action + lVar23;
      }
      else {
        puVar24 = yy_default + uVar3;
      }
      uVar3 = *puVar24;
      if (0xe8 < uVar3) goto LAB_00504154;
      pFVar32 = &yyminor;
      pdVar33 = (double *)&local_d8;
      for (lVar23 = 10; lVar23 != 0; lVar23 = lVar23 + -1) {
        *pdVar33 = pFVar32->fval;
        pFVar32 = (FParseToken *)((long)pFVar32 + (ulong)bVar38 * -0x10 + 8);
        pdVar33 = pdVar33 + (ulong)bVar38 * -2 + 1;
      }
      *(ushort **)yyp = puVar27 + 0x2c;
      if (puVar27 + 0x2c < (ushort *)((long)yyp + 0x2278U)) {
        uVar29 = uVar3 + 0x4e;
        if (uVar3 < 100) {
          uVar29 = (uint)uVar3;
        }
        puVar27[0x2c] = (ushort)uVar29;
        *(uchar *)(puVar27 + 0x2d) = uVar34;
        puVar25 = &local_d8;
        puVar27 = puVar27 + 0x30;
        for (lVar23 = 10; lVar23 != 0; lVar23 = lVar23 + -1) {
          *(undefined8 *)puVar27 = *puVar25;
          puVar25 = puVar25 + (ulong)bVar38 * -2 + 1;
          puVar27 = puVar27 + (ulong)bVar38 * -8 + 4;
        }
        yyTraceShift((yyParser *)yyp,uVar29);
      }
      else {
        yyStackOverflow((yyParser *)yyp);
      }
      iVar22 = *(int *)((long)yyp + 8) + -1;
LAB_00504fb4:
      *(int *)((long)yyp + 8) = iVar22;
LAB_00504fb7:
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
        uVar37 = (long)yyp + 0x70;
        if (uVar37 <= *yyp) {
          uVar30 = 0x5b;
          do {
            fprintf((FILE *)yyTraceFILE,"%c%s",uVar30,yyTokenName[*(byte *)(uVar37 + 2)]);
            uVar37 = uVar37 + 0x58;
            uVar30 = 0x20;
          } while (uVar37 <= *yyp);
        }
        fwrite("]\n",2,1,(FILE *)yyTraceFILE);
        fflush((FILE *)yyTraceFILE);
      }
      return;
    }
LAB_00504154:
    uVar29 = (uint)uVar3;
    if (0x136 < uVar29) {
      if (uVar29 != 0x137) {
        __assert_fail("yyact == YY_ERROR_ACTION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O3/src/xlat_parser.c"
                      ,0x758,"void XlatParse(void *, int, FParseToken, FParseContext *)");
      }
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
        fflush((FILE *)yyTraceFILE);
      }
      if (*(int *)((long)yyp + 8) < 1) {
        pFVar6 = *(FParseContext **)((long)yyp + 0x10);
        FParseContext::PrintError(pFVar6,"syntax error");
        *(FParseContext **)((long)yyp + 0x10) = pFVar6;
      }
      *(undefined4 *)((long)yyp + 8) = 3;
      if (yymajor == 0) {
        uVar30 = *(undefined8 *)((long)yyp + 0x10);
        if (yyTraceFILE != (FILE *)0x0) {
          fprintf((FILE *)yyTraceFILE,"%sFail!\n",yyTracePrompt);
          fflush((FILE *)yyTraceFILE);
        }
        while (puVar31 < *yyp) {
          yy_pop_parser_stack((yyParser *)yyp);
        }
        *(undefined8 *)((long)yyp + 0x10) = uVar30;
        iVar22 = -1;
        goto LAB_00504fb4;
      }
      goto LAB_00504fb7;
    }
    uVar37 = (ulong)(uVar29 - 0xe9);
    pFVar6 = *(FParseContext **)((long)yyp + 0x10);
    bVar2 = yyRuleInfo[uVar37].nrhs;
    if (yyTraceFILE != (FILE *)0x0) {
      fprintf((FILE *)yyTraceFILE,"%sReduce [%s], go to state %d.\n",yyTracePrompt,
              _ZL10yyRuleName_rel + *(int *)(_ZL10yyRuleName_rel + uVar37 * 4),
              (ulong)puVar27[(ulong)bVar2 * -0x2c]);
      fflush((FILE *)yyTraceFILE);
    }
    puVar25 = local_d8;
    iVar22 = NumBoomish;
    if ((bVar2 == 0) && (local_70 <= *yyp)) {
      yyStackOverflow((yyParser *)yyp);
      puVar31 = local_80;
      goto LAB_00504e7a;
    }
    local_60 = (ulong)bVar2;
    uVar20 = local_d8._1_7_;
    uVar41 = local_d8._4_4_;
    switch(uVar29) {
    case 0xea:
      *(int *)(puVar27 + -0x54) = *(int *)(puVar27 + -0x54) + *(int *)(puVar27 + 4);
      break;
    case 0xeb:
      *(int *)(puVar27 + -0x54) = *(int *)(puVar27 + -0x54) - *(int *)(puVar27 + 4);
      break;
    case 0xec:
      iVar22 = *(int *)(puVar27 + 4) * *(int *)(puVar27 + -0x54);
      goto LAB_00504d4f;
    case 0xed:
      if (*(int *)(puVar27 + 4) == 0) {
        iVar22 = FParseContext::PrintError(pFVar6,"Division by zero");
      }
      else {
        iVar22 = *(int *)(puVar27 + -0x54) / *(int *)(puVar27 + 4);
      }
      goto LAB_00504d4f;
    case 0xee:
      if (*(int *)(puVar27 + 4) == 0) {
        FParseContext::PrintError(pFVar6,"Division by zero");
        iVar22 = extraout_EDX;
      }
      else {
        iVar22 = *(int *)(puVar27 + -0x54) % *(int *)(puVar27 + 4);
      }
      *(int *)(puVar27 + -0x54) = iVar22;
      break;
    case 0xef:
      *(uint *)(puVar27 + -0x54) = *(uint *)(puVar27 + -0x54) | *(uint *)(puVar27 + 4);
      break;
    case 0xf0:
      *(uint *)(puVar27 + -0x54) = *(uint *)(puVar27 + -0x54) & *(uint *)(puVar27 + 4);
      break;
    case 0xf1:
      *(uint *)(puVar27 + -0x54) = *(uint *)(puVar27 + -0x54) ^ *(uint *)(puVar27 + 4);
      break;
    case 0xf2:
      *(int *)(puVar27 + -0x28) = -*(int *)(puVar27 + 4);
      break;
    case 0xf3:
    case 0x106:
      iVar22 = *(int *)(puVar27 + -0x28);
      goto LAB_00504d4f;
    case 0xf4:
      puVar31 = puVar27 + -0x80;
      iVar22 = *(int *)(puVar27 + -0x28);
      goto LAB_005047f2;
    case 0xf5:
      pFVar6->EnumVal = 0;
      break;
    case 0xf6:
      puVar31 = puVar27 + 4;
      iVar22 = pFVar6->EnumVal;
      pFVar6->EnumVal = iVar22 + 1;
LAB_005047f2:
      FParseContext::AddSym(pFVar6,(char *)puVar31,iVar22);
      break;
    case 0xf7:
      FParseContext::AddSym(pFVar6,(char *)(puVar27 + -0x54),*(int *)(puVar27 + 4));
      pFVar6->EnumVal = *(int *)(puVar27 + 4) + 1;
      break;
    case 0xf8:
      uVar41 = *(undefined4 *)(puVar27 + 4);
      *(undefined4 *)&pFVar6[1]._vptr_FParseContext = uVar41;
      *(undefined4 *)(puVar27 + 4) = uVar41;
      break;
    case 0xf9:
      uVar29 = *(uint *)(puVar27 + -0x130);
      lVar23 = (long)(int)uVar29;
      if (-1 < lVar23) {
        iVar22 = *(int *)(puVar27 + -0x28);
        iVar5 = *(int *)(puVar27 + -0xd8);
        uVar3 = puVar27[-0x80];
        iVar39 = *(int *)(puVar27 + -0x24);
        iVar40 = *(int *)(puVar27 + -0x22);
        iVar42 = *(int *)(puVar27 + -0x20);
        iVar43 = *(int *)(puVar27 + -0x1e);
        iVar28 = *(int *)(puVar27 + -0x1c);
        if (SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Count <= uVar29) {
          local_78 = *(int *)(puVar27 + -0x1c);
          local_58 = *(int *)(puVar27 + -0x24);
          iStack_54 = *(int *)(puVar27 + -0x22);
          iStack_50 = *(int *)(puVar27 + -0x20);
          iStack_4c = *(int *)(puVar27 + -0x1e);
          TArray<FLineTrans,_FLineTrans>::Resize
                    (&SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>,uVar29 + 1);
          iVar39 = local_58;
          iVar40 = iStack_54;
          iVar42 = iStack_50;
          iVar43 = iStack_4c;
          iVar28 = local_78;
        }
        pFVar17 = SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array;
        SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>.Array[lVar23].special =
             (uint)uVar3;
        pFVar17[lVar23].flags = iVar22 + iVar5;
        piVar26 = pFVar17[lVar23].args;
        *piVar26 = iVar39;
        piVar26[1] = iVar40;
        piVar26[2] = iVar42;
        piVar26[3] = iVar43;
        pFVar17[lVar23].args[4] = iVar28;
      }
      *(undefined4 *)&pFVar6[1]._vptr_FParseContext = 0xffffffff;
      break;
    case 0xfa:
      Printf("%s, line %d: %s is undefined\n",pFVar6->SourceFile,(ulong)(uint)pFVar6->SourceLine,
             puVar27 + -0x80);
      *(undefined4 *)&pFVar6[1]._vptr_FParseContext = 0xffffffff;
      break;
    case 0xfb:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = *(int *)(puVar27 + 4);
      XlatExpressions.Count = XlatExpressions.Count + 1;
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 0;
      goto LAB_00504952;
    case 0xfc:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 1;
LAB_00504952:
      uVar29 = XlatExpressions.Count + 1;
      *(uint *)(puVar27 + 4) = XlatExpressions.Count;
      XlatExpressions.Count = uVar29;
      break;
    case 0xfd:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 2;
      goto LAB_00504a67;
    case 0xfe:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 3;
      goto LAB_00504a67;
    case 0xff:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 4;
      goto LAB_00504a67;
    case 0x100:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 5;
      goto LAB_00504a67;
    case 0x101:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 6;
      goto LAB_00504a67;
    case 0x102:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 8;
      goto LAB_00504a67;
    case 0x103:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 7;
      goto LAB_00504a67;
    case 0x104:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 9;
LAB_00504a67:
      uVar29 = XlatExpressions.Count + 1;
      *(uint *)(puVar27 + -0x54) = XlatExpressions.Count;
      XlatExpressions.Count = uVar29;
      break;
    case 0x105:
      TArray<int,_int>::Grow(&XlatExpressions,1);
      XlatExpressions.Array[XlatExpressions.Count] = 10;
      uVar29 = XlatExpressions.Count + 1;
      *(uint *)(puVar27 + -0x28) = XlatExpressions.Count;
      XlatExpressions.Count = uVar29;
      break;
    case 0x107:
      uVar4 = *(uint *)(puVar27 + 4);
      if ((long)XlatExpressions.Array[(int)uVar4] == 1) {
        local_d8 = (undefined8 *)0x100000000;
        puVar25 = local_d8;
        uVar29 = XlatExpressions.Count;
        if ((uVar4 < XlatExpressions.Count) &&
           (XlatExpressions.Count = XlatExpressions.Count - 1, uVar29 = XlatExpressions.Count,
           uVar4 < XlatExpressions.Count)) {
          memmove(XlatExpressions.Array + uVar4,XlatExpressions.Array + (ulong)uVar4 + 1,
                  (ulong)(XlatExpressions.Count - uVar4) << 2);
          puVar25 = local_d8;
          uVar29 = XlatExpressions.Count;
        }
      }
      else {
        local_3c.linetype = *(int *)&pFVar6[1]._vptr_FParseContext;
        local_3c.tag = 0;
        local_3c.bIsConstant = true;
        piVar26 = (*XlatExprEval[XlatExpressions.Array[(int)uVar4]])
                            ((int *)&local_74,XlatExpressions.Array + (int)uVar4,&local_3c);
        if (local_3c.bIsConstant == true) {
          local_d8 = (undefined8 *)(ulong)local_74;
          if (piVar26 + 1 < XlatExpressions.Array) {
            __assert_fail("endpt >= &XlatExpressions[0]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/xlat/xlat_parser.y"
                          ,0x9b,"void yy_reduce(yyParser *, unsigned int)");
          }
          uVar29 = (uint)((ulong)((long)(piVar26 + 1) - (long)XlatExpressions.Array) >> 2);
          puVar25 = local_d8;
          if (XlatExpressions.Count <= uVar29 && uVar29 - XlatExpressions.Count != 0) {
            TArray<int,_int>::Grow(&XlatExpressions,uVar29 - XlatExpressions.Count);
            puVar25 = local_d8;
          }
        }
        else {
          local_d8 = (undefined8 *)CONCAT44(2,*(undefined4 *)(puVar27 + 4));
          puVar25 = local_d8;
          uVar29 = XlatExpressions.Count;
        }
      }
      goto LAB_00504d6d;
    case 0x108:
      iVar22 = *(int *)(puVar27 + 6) << 0x14;
      local_d8 = (undefined8 *)CONCAT44(1,iVar22);
      auStack_d0[0] = *(undefined4 *)(puVar27 + 4);
      auStack_d0[1] = 0;
      auStack_d0[2] = 0;
      auStack_d0[3] = 0;
      auStack_d0[4] = 0;
      puVar27[10] = 0;
      puVar27[0xb] = 0;
      puVar27[0xc] = 0;
      puVar27[0xd] = 0;
      puVar27[0xe] = 0;
      puVar27[0xf] = 0;
      puVar27[0x10] = 0;
      puVar27[0x11] = 0;
      uVar41 = 1;
      goto LAB_005048af;
    case 0x109:
      uVar30 = *(undefined8 *)(puVar27 + -0x54);
      auStack_d0[0] = (undefined4)*(undefined8 *)(puVar27 + -0x50);
      auStack_d0[1] = (undefined4)*(undefined8 *)(puVar27 + -0x4e);
      auStack_d0[2] = (undefined4)((ulong)*(undefined8 *)(puVar27 + -0x4e) >> 0x20);
      auStack_d0[3] = (undefined4)*(undefined8 *)(puVar27 + -0x4a);
      auStack_d0[4] = (undefined4)((ulong)*(undefined8 *)(puVar27 + -0x4a) >> 0x20);
      local_d8._4_4_ = (int)((ulong)uVar30 >> 0x20);
      iVar22 = local_d8._4_4_;
      local_d8._0_4_ = (uint)uVar30;
      if ((long)local_d8._4_4_ < 5) {
        iVar22 = *(int *)(puVar27 + 6);
        auStack_d0[local_d8._4_4_] = *(undefined4 *)(puVar27 + 4);
        local_d8 = (undefined8 *)
                   CONCAT44(local_d8._4_4_ + 1,
                            (uint)local_d8 |
                            iVar22 << ((char)((ulong)uVar30 >> 0x20) * '\x02' + 0x14U & 0x1f));
      }
      else {
        local_d8 = (undefined8 *)CONCAT44(local_d8._4_4_ + 1,(uint)local_d8);
        if (iVar22 == 5) {
          FParseContext::PrintError(pFVar6,"Line special has too many arguments\n");
        }
      }
      *(ulong *)(puVar27 + -0x4e) = CONCAT44(auStack_d0[2],auStack_d0[1]);
      *(ulong *)(puVar27 + -0x4a) = CONCAT44(auStack_d0[4],auStack_d0[3]);
      goto LAB_00504c97;
    case 0x10a:
      puVar27[0x36] = 0;
      puVar27[0x37] = 0;
      puVar27[0x38] = 0;
      puVar27[0x39] = 0;
      puVar27[0x3a] = 0;
      puVar27[0x3b] = 0;
      puVar27[0x3c] = 0;
      puVar27[0x3d] = 0;
      puVar27[0x30] = 0;
      puVar27[0x31] = 0;
      puVar27[0x32] = 0;
      puVar27[0x33] = 0;
      puVar27[0x34] = 0;
      puVar27[0x35] = 0;
      puVar27[0x36] = 0;
      puVar27[0x37] = 0;
      break;
    case 0x10b:
      lVar23 = (long)NumBoomish;
      if (lVar23 == 0x10) {
        puVar25 = *(undefined8 **)(puVar27 + -0x28);
        while (puVar25 != (undefined8 *)0x0) {
          puVar8 = (undefined8 *)*puVar25;
          operator_delete(puVar25,0x40);
          puVar25 = puVar8;
        }
        Printf("%s, line %d: Too many BOOM translators\n",pFVar6->SourceFile,
               (ulong)(uint)pFVar6->SourceLine);
      }
      else {
        Boomish[lVar23].FirstLinetype = puVar27[-0x104];
        Boomish[lVar23].LastLinetype = puVar27[-0xac];
        Boomish[lVar23].NewSpecial = (BYTE)puVar27[-0x188];
        puVar25 = *(undefined8 **)(puVar27 + -0x28);
        iVar5 = NumBoomish;
        NumBoomish = iVar22;
        while (puVar25 != (undefined8 *)0x0) {
          puVar8 = (undefined8 *)*puVar25;
          NumBoomish = iVar5;
          TArray<FBoomArg,_FBoomArg>::Grow(&Boomish[iVar5].Args,1);
          pFVar9 = Boomish[iVar5].Args.Array;
          uVar29 = Boomish[iVar5].Args.Count;
          *(undefined8 *)(pFVar9[uVar29].ResultValue + 8) = *(undefined8 *)((long)puVar25 + 0x36);
          uVar30 = puVar25[1];
          uVar13 = puVar25[2];
          uVar14 = puVar25[3];
          uVar15 = puVar25[4];
          uVar16 = puVar25[6];
          *(undefined8 *)(pFVar9[uVar29].ResultFilter + 0xc) = puVar25[5];
          *(undefined8 *)(pFVar9[uVar29].ResultFilter + 0xc + 4) = uVar16;
          *(undefined8 *)(pFVar9[uVar29].ResultFilter + 4) = uVar14;
          *(undefined8 *)(pFVar9[uVar29].ResultFilter + 4 + 4) = uVar15;
          pFVar9 = pFVar9 + uVar29;
          pFVar9->bOrExisting = (bool)(char)uVar30;
          pFVar9->bUseConstant = (bool)(char)((ulong)uVar30 >> 8);
          pFVar9->ListSize = (char)((ulong)uVar30 >> 0x10);
          pFVar9->ArgNum = (char)((ulong)uVar30 >> 0x18);
          pFVar9->ConstantValue = (char)((ulong)uVar30 >> 0x20);
          pFVar9->field_0x5 = (char)((ulong)uVar30 >> 0x28);
          pFVar9->AndValue = (short)((ulong)uVar30 >> 0x30);
          *(undefined8 *)pFVar9->ResultFilter = uVar13;
          puVar1 = &Boomish[iVar5].Args.Count;
          *puVar1 = *puVar1 + 1;
          operator_delete(puVar25,0x40);
          puVar25 = puVar8;
          iVar5 = NumBoomish;
        }
        NumBoomish = NumBoomish + 1;
      }
      break;
    case 0x10c:
      puVar27[0x30] = 0;
      puVar27[0x31] = 0;
      puVar27[0x32] = 0;
      puVar27[0x33] = 0;
      break;
    case 0x10d:
      puVar25 = (undefined8 *)operator_new(0x40);
      *puVar25 = *(undefined8 *)(puVar27 + 4);
      *(undefined8 *)((long)puVar25 + 0x36) = *(undefined8 *)(puVar27 + -0x11);
      uVar41 = *(undefined4 *)(puVar27 + -0x28);
      uVar10 = *(undefined4 *)(puVar27 + -0x26);
      uVar11 = *(undefined4 *)(puVar27 + -0x24);
      uVar12 = *(undefined4 *)(puVar27 + -0x22);
      uVar30 = *(undefined8 *)(puVar27 + -0x20);
      uVar13 = *(undefined8 *)(puVar27 + -0x1c);
      uVar14 = *(undefined8 *)(puVar27 + -0x14);
      puVar25[5] = *(undefined8 *)(puVar27 + -0x18);
      puVar25[6] = uVar14;
      puVar25[3] = uVar30;
      puVar25[4] = uVar13;
      *(undefined4 *)(puVar25 + 1) = uVar41;
      *(undefined4 *)((long)puVar25 + 0xc) = uVar10;
      *(undefined4 *)(puVar25 + 2) = uVar11;
      *(undefined4 *)((long)puVar25 + 0x14) = uVar12;
      *(undefined8 **)(puVar27 + -0x28) = puVar25;
      break;
    case 0x10e:
      plVar36 = *(long **)(puVar27 + 8);
      local_d8._0_2_ = CONCAT11(plVar36 == (long *)0x0,*(int *)(puVar27 + -0x28) == 0x14);
      local_d8._0_4_ = CONCAT13((char)puVar27[-0x54],(undefined3)local_d8);
      local_d8._5_3_ = SUB83(puVar25,5);
      local_d8._0_5_ = CONCAT14((char)puVar27[4],(uint)local_d8);
      local_d8 = (undefined8 *)CONCAT26(puVar27[5],(undefined6)local_d8);
      if (plVar36 != (long *)0x0) {
        uVar35 = 0;
        do {
          plVar7 = (long *)*plVar36;
          if (uVar35 < 0xf) {
            *(short *)((long)auStack_d0 + uVar35 * 2) = (short)plVar36[1];
            *(undefined1 *)((long)&local_b8 + uVar35 + 6) = *(undefined1 *)((long)plVar36 + 10);
          }
          else if (uVar35 == 0xf) {
            FParseContext::PrintError(pFVar6,"Lists can only have 15 elements");
          }
          operator_delete(plVar36,0x10);
          uVar35 = uVar35 + 1;
          plVar36 = plVar7;
        } while (plVar7 != (long *)0x0);
        uVar21 = 0xf;
        if ((uint)uVar35 < 0xf) {
          uVar21 = (undefined1)uVar35;
        }
        local_d8._0_3_ = CONCAT12(uVar21,(undefined2)local_d8);
      }
      *(ulong *)(puVar27 + -0x3d) = CONCAT62(uStack_a8,uStack_aa);
      *(undefined8 *)(puVar27 + -0x44) = local_b8;
      *(ulong *)(puVar27 + -0x40) = CONCAT26(uStack_aa,uStack_b0);
      *(ulong *)(puVar27 + -0x4c) = CONCAT44(auStack_d0[3],auStack_d0[2]);
      *(ulong *)(puVar27 + -0x48) = CONCAT44(auStack_d0[5],auStack_d0[4]);
LAB_00504c97:
      *(uint *)(puVar27 + -0x54) = (uint)local_d8;
      *(int *)(puVar27 + -0x52) = local_d8._4_4_;
      *(undefined4 *)(puVar27 + -0x50) = auStack_d0[0];
      *(undefined4 *)(puVar27 + -0x4e) = auStack_d0[1];
      break;
    case 0x10f:
      puVar27[4] = 4;
      puVar27[5] = 0;
      break;
    case 0x110:
      puVar27[4] = 0;
      puVar27[5] = 0;
      break;
    case 0x111:
    case 0x122:
      puVar27[4] = 1;
      puVar27[5] = 0;
      break;
    case 0x112:
      puVar27[4] = 2;
      puVar27[5] = 0;
      break;
    case 0x113:
      puVar27[4] = 3;
      puVar27[5] = 0;
      break;
    case 0x114:
      puVar27[4] = 0x3d;
      puVar27[5] = 0;
      break;
    case 0x115:
      puVar27[4] = 0x14;
      puVar27[5] = 0;
      break;
    case 0x116:
      local_d8 = (undefined8 *)CONCAT71(uVar20,(char)puVar27[4]);
      auStack_d0[0] = 0;
      auStack_d0[1] = 0;
      iVar22 = (uint)local_d8;
LAB_005048af:
      auStack_d0[1] = 0;
      *(int *)(puVar27 + 4) = iVar22;
      *(undefined4 *)(puVar27 + 6) = uVar41;
      *(undefined4 *)(puVar27 + 8) = auStack_d0[0];
      puVar27[10] = 0;
      puVar27[0xb] = 0;
      break;
    case 0x117:
      local_d8._0_4_ = CONCAT22(puVar27[-0x80],(undefined2)local_d8);
      local_d8 = (undefined8 *)CONCAT44(uVar41,(uint)local_d8);
      auStack_d0[0] = (undefined4)*(undefined8 *)(puVar27 + -0x28);
      auStack_d0[1] = (undefined4)((ulong)*(undefined8 *)(puVar27 + -0x28) >> 0x20);
      *(uint *)(puVar27 + -0x80) = (uint)local_d8;
      *(undefined4 *)(puVar27 + -0x7e) = uVar41;
      *(undefined4 *)(puVar27 + -0x7c) = auStack_d0[0];
      *(undefined4 *)(puVar27 + -0x7a) = auStack_d0[1];
      break;
    case 0x118:
      puVar25 = (undefined8 *)operator_new(0x10);
      *puVar25 = 0;
      *(undefined4 *)(puVar25 + 1) = *(undefined4 *)(puVar27 + 4);
      uVar29 = XlatExpressions.Count;
LAB_00504d6d:
      XlatExpressions.Count = uVar29;
      *(undefined8 **)(puVar27 + 4) = puVar25;
      break;
    case 0x119:
      puVar25 = (undefined8 *)operator_new(0x10);
      *puVar25 = *(undefined8 *)(puVar27 + 4);
      *(undefined4 *)(puVar25 + 1) = *(undefined4 *)(puVar27 + -0x54);
      *(undefined8 **)(puVar27 + -0x54) = puVar25;
      break;
    case 0x11a:
      local_d8._0_3_ = CONCAT12((char)puVar27[4],puVar27[-0x54]);
      iVar22 = (uint)local_d8;
LAB_00504d4f:
      *(int *)(puVar27 + -0x54) = iVar22;
      break;
    case 0x11b:
      TArray<FLineTrans,_FLineTrans>::Resize
                (&SimpleLineTranslations.super_TArray<FLineTrans,_FLineTrans>,
                 *(int *)(puVar27 + -0x28) + 1);
      break;
    case 0x11c:
      uVar29 = *(uint *)(puVar27 + -0x80);
      lVar23 = (long)(int)uVar29;
      if (-1 < lVar23) {
        iVar22 = *(int *)(puVar27 + -0x28);
        if (SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Count <= uVar29) {
          TArray<FSectorTrans,_FSectorTrans>::Resize
                    (&SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>,uVar29 + 1);
        }
        pFVar18 = SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Array;
        SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Array[lVar23].newtype = iVar22;
        pFVar18[lVar23].bitmask_allowed = true;
      }
      break;
    case 0x11d:
      Printf("Unknown constant \'%s\'\n",puVar27 + -0x28);
      break;
    case 0x11e:
      uVar29 = *(uint *)(puVar27 + -0xac);
      lVar23 = (long)(int)uVar29;
      if (-1 < lVar23) {
        iVar22 = *(int *)(puVar27 + -0x54);
        if (SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Count <= uVar29) {
          TArray<FSectorTrans,_FSectorTrans>::Resize
                    (&SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>,uVar29 + 1);
        }
        pFVar18 = SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Array;
        SectorTranslations.super_TArray<FSectorTrans,_FSectorTrans>.Array[lVar23].newtype = iVar22;
        pFVar18[lVar23].bitmask_allowed = false;
      }
      break;
    case 0x11f:
      iVar22 = *(int *)(puVar27 + -0x80);
      iVar5 = *(int *)(puVar27 + -0x54);
      iVar39 = *(int *)(puVar27 + -0x28);
      TArray<FSectorMask,_FSectorMask>::Grow(&SectorMasks,1);
      pFVar19 = SectorMasks.Array;
      uVar35 = (ulong)SectorMasks.Count;
      SectorMasks.Array[uVar35].mask = iVar22;
      pFVar19[uVar35].op = iVar5;
      pFVar19[uVar35].shift = iVar39;
      goto LAB_00504b03;
    case 0x120:
      iVar22 = *(int *)(puVar27 + -0x28);
      TArray<FSectorMask,_FSectorMask>::Grow(&SectorMasks,1);
      pFVar19 = SectorMasks.Array;
      uVar35 = (ulong)SectorMasks.Count;
      SectorMasks.Array[uVar35].mask = iVar22;
      pFVar19[uVar35].op = 0;
      pFVar19[uVar35].shift = 0;
      goto LAB_00504b03;
    case 0x121:
      iVar22 = *(int *)(puVar27 + -0x54);
      TArray<FSectorMask,_FSectorMask>::Grow(&SectorMasks,1);
      pFVar19 = SectorMasks.Array;
      uVar35 = (ulong)SectorMasks.Count;
      SectorMasks.Array[uVar35].mask = iVar22;
      pFVar19[uVar35].op = 0;
      pFVar19[uVar35].shift = 1;
LAB_00504b03:
      SectorMasks.Count = SectorMasks.Count + 1;
      break;
    case 0x123:
      puVar27[4] = 0xffff;
      puVar27[5] = 0xffff;
      break;
    case 0x124:
      if ((ulong)*(uint *)(puVar27 + -0x80) < 0x10) {
        LineFlagTranslations[*(uint *)(puVar27 + -0x80)].newvalue = *(int *)(puVar27 + -0x28);
        LineFlagTranslations[*(int *)(puVar27 + -0x80)].ismask = false;
      }
      break;
    case 0x125:
      if ((ulong)*(uint *)(puVar27 + -0x80) < 0x10) {
        LineFlagTranslations[*(uint *)(puVar27 + -0x80)].newvalue = *(int *)(puVar27 + -0x28);
        LineFlagTranslations[*(int *)(puVar27 + -0x80)].ismask = true;
      }
    }
    puVar31 = local_80;
    if (0x31 < (ulong)puVar27[local_60 * -0x2c]) {
      __assert_fail("stateno<=YY_REDUCE_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O3/src/xlat_parser.c"
                    ,0x32f,"int yy_find_reduce_action(int, unsigned char)");
    }
    bVar2 = yyRuleInfo[uVar37].lhs;
    if (bVar2 == 0x47) {
      __assert_fail("iLookAhead!=YYNOCODE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O3/src/xlat_parser.c"
                    ,0x333,"int yy_find_reduce_action(int, unsigned char)");
    }
    uVar29 = (int)yy_reduce_ofst[puVar27[local_60 * -0x2c]] + (uint)bVar2;
    if (0x165 < uVar29) {
      __assert_fail("i>=0 && i<YY_ACTTAB_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O3/src/xlat_parser.c"
                    ,0x33a,"int yy_find_reduce_action(int, unsigned char)");
    }
    if ("+,-./012345)*8:;\x02\x03\x04\x05\x06\a\b\t\x0f\x02\x03\x04\x05\x06\a\b\t\x02\x03\x04\x05\x06\a\b\t\x05\x06\a\b\t ABC$%&"
        [uVar29] != bVar2) {
      __assert_fail("yy_lookahead[i]==iLookAhead",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O3/src/xlat_parser.c"
                    ,0x33b,"int yy_find_reduce_action(int, unsigned char)");
    }
    if (uVar29 == 0xb) {
      puVar27 = (ushort *)(local_60 * -0x58 + *yyp);
      *(ushort **)yyp = puVar27;
      uVar30 = *(undefined8 *)((long)yyp + 0x10);
      if (yyTraceFILE != (FILE *)0x0) {
        fprintf((FILE *)yyTraceFILE,"%sAccept!\n",yyTracePrompt);
        fflush((FILE *)yyTraceFILE);
        puVar27 = *yyp;
      }
      *(undefined4 *)((long)yyp + 8) = 0xffffffff;
      while (puVar31 < puVar27) {
        yy_pop_parser_stack((yyParser *)yyp);
        puVar27 = *yyp;
      }
      *(undefined8 *)((long)yyp + 0x10) = uVar30;
    }
    else {
      if (uVar29 == 0x35) {
        __assert_fail("yyact == YY_ACCEPT_ACTION",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/build_O3/src/xlat_parser.c"
                      ,0x6d1,"void yy_reduce(yyParser *, unsigned int)");
      }
      uVar3 = yy_action[uVar29];
      uVar29 = uVar3 + 0x4e;
      if (uVar3 < 100) {
        uVar29 = (uint)uVar3;
      }
      lVar23 = 1 - local_60;
      *(ushort **)yyp = puVar27 + lVar23 * 0x2c;
      puVar27[lVar23 * 0x2c] = (ushort)uVar29;
      *(byte *)(puVar27 + lVar23 * 0x2c + 1) = bVar2;
      yyTraceShift((yyParser *)yyp,uVar29);
    }
LAB_00504e7a:
    if ((yymajor == 0x47) || (puVar27 = *yyp, puVar27 <= puVar31)) goto LAB_00504fb7;
  } while( true );
}

Assistant:

void XlatParse(
  void *yyp,                   /* The parser */
  int yymajor,                 /* The major token code number */
  XlatParseTOKENTYPE yyminor       /* The value for the token */
  XlatParseARG_PDECL               /* Optional %extra_argument parameter */
){
  YYMINORTYPE yyminorunion;
  unsigned int yyact;   /* The parser action. */
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  int yyendofinput;     /* True if we are at the end of input */
#endif
#ifdef YYERRORSYMBOL
  int yyerrorhit = 0;   /* True if yymajor has invoked an error */
#endif
  yyParser *yypParser;  /* The parser */

  yypParser = (yyParser*)yyp;
  assert( yypParser->yytos!=0 );
#if !defined(YYERRORSYMBOL) && !defined(YYNOERRORRECOVERY)
  yyendofinput = (yymajor==0);
#endif
  XlatParseARG_STORE;

#ifndef NDEBUG
  if( yyTraceFILE ){
    fprintf(yyTraceFILE,"%sInput '%s'\n",yyTracePrompt,yyTokenName[yymajor]);
    fflush(yyTraceFILE);
  }
#endif

  do{
    yyact = yy_find_shift_action(yypParser,(YYCODETYPE)yymajor);
    if( yyact <= YY_MAX_SHIFTREDUCE ){
      yy_shift(yypParser,yyact,yymajor,yyminor);
#ifndef YYNOERRORRECOVERY
      yypParser->yyerrcnt--;
#endif
      yymajor = YYNOCODE;
    }else if( yyact <= YY_MAX_REDUCE ){
      yy_reduce(yypParser,yyact-YY_MIN_REDUCE);
    }else{
      assert( yyact == YY_ERROR_ACTION );
      yyminorunion.yy0 = yyminor;
#ifdef YYERRORSYMBOL
      int yymx;
#endif
#ifndef NDEBUG
      if( yyTraceFILE ){
        fprintf(yyTraceFILE,"%sSyntax Error!\n",yyTracePrompt);
        fflush(yyTraceFILE);
      }
#endif
#ifdef YYERRORSYMBOL
      /* A syntax error has occurred.
      ** The response to an error depends upon whether or not the
      ** grammar defines an error token "ERROR".  
      **
      ** This is what we do if the grammar does define ERROR:
      **
      **  * Call the %syntax_error function.
      **
      **  * Begin popping the stack until we enter a state where
      **    it is legal to shift the error symbol, then shift
      **    the error symbol.
      **
      **  * Set the error count to three.
      **
      **  * Begin accepting and shifting new tokens.  No new error
      **    processing will occur until three tokens have been
      **    shifted successfully.
      **
      */
      if( yypParser->yyerrcnt<0 ){
        yy_syntax_error(yypParser,yymajor,yyminor);
      }
      yymx = yypParser->yytos->major;
      if( yymx==YYERRORSYMBOL || yyerrorhit ){
#ifndef NDEBUG
        if( yyTraceFILE ){
          fprintf(yyTraceFILE,"%sDiscard input token %s\n",
             yyTracePrompt,yyTokenName[yymajor]);
          fflush(yyTraceFILE);
        }
#endif
        yy_destructor(yypParser, (YYCODETYPE)yymajor, &yyminorunion);
        yymajor = YYNOCODE;
      }else{
        while( yypParser->yytos >= yypParser->yystack
            && yymx != YYERRORSYMBOL
            && (yyact = yy_find_reduce_action(
                        yypParser->yytos->stateno,
                        YYERRORSYMBOL)) >= YY_MIN_REDUCE
        ){
          yy_pop_parser_stack(yypParser);
        }
        if( yypParser->yytos < yypParser->yystack || yymajor==0 ){
          yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
          yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
          yypParser->yyerrcnt = -1;
#endif
          yymajor = YYNOCODE;
        }else if( yymx!=YYERRORSYMBOL ){
          yy_shift(yypParser,yyact,YYERRORSYMBOL,yyminor);
        }
      }
      yypParser->yyerrcnt = 3;
      yyerrorhit = 1;
#elif defined(YYNOERRORRECOVERY)
      /* If the YYNOERRORRECOVERY macro is defined, then do not attempt to
      ** do any kind of error recovery.  Instead, simply invoke the syntax
      ** error routine and continue going as if nothing had happened.
      **
      ** Applications can set this macro (for example inside %include) if
      ** they intend to abandon the parse upon the first syntax error seen.
      */
      yy_syntax_error(yypParser,yymajor, yyminor);
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      yymajor = YYNOCODE;
      
#else  /* YYERRORSYMBOL is not defined */
      /* This is what we do if the grammar does not define ERROR:
      **
      **  * Report an error message, and throw away the input token.
      **
      **  * If the input token is $, then fail the parse.
      **
      ** As before, subsequent error messages are suppressed until
      ** three input tokens have been successfully shifted.
      */
      if( yypParser->yyerrcnt<=0 ){
        yy_syntax_error(yypParser,yymajor, yyminor);
      }
      yypParser->yyerrcnt = 3;
      yy_destructor(yypParser,(YYCODETYPE)yymajor,&yyminorunion);
      if( yyendofinput ){
        yy_parse_failed(yypParser);
#ifndef YYNOERRORRECOVERY
        yypParser->yyerrcnt = -1;
#endif
      }
      yymajor = YYNOCODE;
#endif
    }
  }while( yymajor!=YYNOCODE && yypParser->yytos>yypParser->yystack );
#ifndef NDEBUG
  if( yyTraceFILE ){
    yyStackEntry *i;
    char cDiv = '[';
    fprintf(yyTraceFILE,"%sReturn. Stack=",yyTracePrompt);
    for(i=&yypParser->yystack[1]; i<=yypParser->yytos; i++){
      fprintf(yyTraceFILE,"%c%s", cDiv, yyTokenName[i->major]);
      cDiv = ' ';
    }
    fprintf(yyTraceFILE,"]\n");
    fflush(yyTraceFILE);
  }
#endif
  return;
}